

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultilineTextBox.cpp
# Opt level: O1

String * anon_unknown.dwarf_19fb1d::combineStrings
                   (String *__return_storage_ptr__,
                   vector<sf::String,_std::allocator<sf::String>_> *stringArray)

{
  char *ansiString;
  ulong uVar1;
  long local_88;
  locale local_78 [8];
  String local_70;
  String local_50;
  
  sf::String::String(__return_storage_ptr__);
  if ((stringArray->super__Vector_base<sf::String,_std::allocator<sf::String>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (stringArray->super__Vector_base<sf::String,_std::allocator<sf::String>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    local_88 = 0;
    uVar1 = 0;
    do {
      ansiString = "\n";
      if (uVar1 == 0) {
        ansiString = "";
      }
      std::locale::locale(local_78);
      sf::String::String(&local_70,ansiString,local_78);
      sf::operator+(&local_50,&local_70,
                    (String *)
                    ((long)&(((stringArray->
                              super__Vector_base<sf::String,_std::allocator<sf::String>_>)._M_impl.
                              super__Vector_impl_data._M_start)->m_string)._M_dataplus._M_p +
                    local_88));
      sf::String::operator+=(__return_storage_ptr__,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
           *)local_50.m_string._M_dataplus._M_p != &local_50.m_string.field_2) {
        operator_delete(local_50.m_string._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
           *)local_70.m_string._M_dataplus._M_p != &local_70.m_string.field_2) {
        operator_delete(local_70.m_string._M_dataplus._M_p);
      }
      std::locale::~locale(local_78);
      uVar1 = uVar1 + 1;
      local_88 = local_88 + 0x20;
    } while (uVar1 < (ulong)((long)(stringArray->
                                   super__Vector_base<sf::String,_std::allocator<sf::String>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(stringArray->
                                   super__Vector_base<sf::String,_std::allocator<sf::String>_>).
                                   _M_impl.super__Vector_impl_data._M_start >> 5));
  }
  return __return_storage_ptr__;
}

Assistant:

sf::String combineStrings(const std::vector<sf::String>& stringArray) {
    sf::String str;
    for (size_t i = 0; i < stringArray.size(); ++i) {
        str += (i == 0 ? "" : "\n") + stringArray[i];
    }
    return str;
}